

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.h
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::ColSizeWriter::Write
          (ColSizeWriter *this,int s)

{
  uint in_ESI;
  long *in_RDI;
  
  if ((int)in_RDI[1] == 1) {
    in_RDI[2] = (long)(int)in_ESI + in_RDI[2];
    TextFormatter::apr((TextFormatter *)*in_RDI,(File *)(*in_RDI + 0x138),"%z\n",in_RDI[2]);
  }
  else if ((int)in_RDI[1] == 2) {
    TextFormatter::apr((TextFormatter *)*in_RDI,(File *)(*in_RDI + 0x138),"%d\n",(ulong)in_ESI);
  }
  *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
  return;
}

Assistant:

void Write(int s) {
      switch(kind_) {
      case 1:
        sum_ += s;
        nlw_.apr(nlw_.nm, "%z\n", sum_);
        break;
      case 2:
        nlw_.apr(nlw_.nm, "%d\n", s);
        break;
      default:
        assert(0 && "why am I here?");
      }
      ++nWrt_;
    }